

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

void __thiscall
OpenMD::GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo(GreaterThanOrEqualTo<int> *this,int rhs)

{
  stringstream iss;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_._M_dataplus.
  _M_p = (pointer)&(this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).
                   description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>).description_.field_2.
  _M_local_buf[0] = '\0';
  this->rhs_ = rhs;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"greater than or equal to",0x18);
  std::ostream::operator<<(local_198,rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

GreaterThanOrEqualTo(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "greater than or equal to" << rhs;
      this->description_ = iss.str();
    }